

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShmSystemV.cpp
# Opt level: O3

void __thiscall adios2::transport::ShmSystemV::CheckBuffer(ShmSystemV *this,string *hint)

{
  ulong __val;
  bool bVar1;
  char cVar2;
  long *plVar3;
  ulong uVar4;
  long *plVar5;
  size_type *psVar6;
  char cVar7;
  string __str;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  char *local_130;
  uint local_128;
  char local_120 [16];
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  string local_70;
  string local_50;
  
  if (this->m_Buffer == (char *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Toolkit","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"transport::shm::ShmSystemV","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CheckBuffer","");
    __val = this->m_Size;
    cVar7 = '\x01';
    if (9 < __val) {
      uVar4 = __val;
      cVar2 = '\x04';
      do {
        cVar7 = cVar2;
        if (uVar4 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_00667c1b;
        }
        if (uVar4 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_00667c1b;
        }
        if (uVar4 < 10000) goto LAB_00667c1b;
        bVar1 = 99999 < uVar4;
        uVar4 = uVar4 / 10000;
        cVar2 = cVar7 + '\x04';
      } while (bVar1);
      cVar7 = cVar7 + '\x01';
    }
LAB_00667c1b:
    local_130 = local_120;
    std::__cxx11::string::_M_construct((ulong)&local_130,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_130,local_128,__val);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x75152b);
    local_150 = &local_140;
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_140 = *plVar5;
      lStack_138 = plVar3[3];
    }
    else {
      local_140 = *plVar5;
      local_150 = (long *)*plVar3;
    }
    local_148 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_150);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_e0 = *plVar5;
      lStack_d8 = plVar3[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar5;
      local_f0 = (long *)*plVar3;
    }
    local_e8 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_f0,
                                (ulong)(this->super_Transport).m_Name._M_dataplus._M_p);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_c0 = *plVar5;
      lStack_b8 = plVar3[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar5;
      local_d0 = (long *)*plVar3;
    }
    local_c8 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_a0 = *plVar5;
      lStack_98 = plVar3[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar5;
      local_b0 = (long *)*plVar3;
    }
    local_a8 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b0,(ulong)(hint->_M_dataplus)._M_p);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90.field_2._8_8_ = plVar3[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_90._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_50,&local_70,&local_110,&local_90,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    if (local_130 != local_120) {
      operator_delete(local_130);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void ShmSystemV::CheckBuffer(const std::string hint) const
{
    if (m_Buffer == nullptr)
    {
        helper::Throw<std::ios_base::failure>(
            "Toolkit", "transport::shm::ShmSystemV", "CheckBuffer",
            "nullptr shared memory segment of size " + std::to_string(m_Size) + " and name " +
                m_Name + " " + hint);
    }
}